

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<false,false>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  byte *pbVar1;
  byte bVar2;
  Scanner<UTF8EncodingPolicyBase<false>> SVar3;
  byte *last;
  undefined8 *puVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  int iVar8;
  undefined4 *puVar9;
  IdentPtr pIVar10;
  uint32 cch;
  uint uVar11;
  uint uVar12;
  char16 cVar13;
  char16_t *prgch;
  byte *pbVar14;
  char16 local_46;
  HRESULT local_44;
  OLECHAR lower;
  byte *pbStack_40;
  uint local_38;
  char16 local_32;
  int wT;
  OLECHAR ch;
  
  pbVar14 = *pp;
  last = *(byte **)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf3);
  *(undefined4 *)(this + 0x51c) = 0;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_00d5654c:
  pbVar1 = pbVar14 + 1;
  pbStack_40 = pbVar1;
  if (last <= pbVar14) {
    local_32 = L'\0';
LAB_00d565b4:
    if (last < pbVar1) {
LAB_00d56abf:
      *(byte **)(this + 0x4e0) = pbVar14;
      Scanner<UTF8EncodingPolicyBase<false>_>::Error
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
    }
LAB_00d565bd:
    uVar12 = 0;
    goto LAB_00d565cd;
  }
  bVar2 = *pbVar14;
  uVar12 = (uint)bVar2;
  local_32 = (char16)bVar2;
  if (bVar2 == 0) goto LAB_00d565b4;
  if ((bVar2 != 0x22) && (bVar2 != 0x27)) {
    if (bVar2 != 0x5c) {
      if ((bVar2 == 0xd) || (bVar2 == 10)) goto LAB_00d56abf;
      if ((char)bVar2 < '\0') {
        local_32 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                             ((UTF8EncodingPolicyBase<false> *)(this + 8),local_32,
                              &stack0xffffffffffffffc0,last);
        uVar12 = (uint)(ushort)local_32;
      }
      goto LAB_00d565cd;
    }
    SVar3 = this[0x508];
    this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 8);
    pbStack_40 = pbVar14 + 2;
    if (last <= pbVar1) {
      local_32 = L'\0';
LAB_00d5666d:
      if (last <= pbStack_40) {
        local_44 = -0x7ff5fc09;
        goto LAB_00d56ae3;
      }
      goto LAB_00d565bd;
    }
    bVar2 = *pbVar1;
    uVar12 = (uint)bVar2;
    local_32 = (char16)bVar2;
    switch(bVar2) {
    case 0x6e:
      local_32 = L'\n';
      uVar12 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x77:
switchD_00d56689_caseD_6f:
      if (-1 < (char)bVar2) break;
      local_32 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                           ((UTF8EncodingPolicyBase<false> *)(this + 8),local_32,
                            &stack0xffffffffffffffc0,last);
      uVar12 = (uint)(ushort)local_32;
      uVar11 = uVar12;
      if ((local_32 & 0xfffeU) != 0x2028) break;
LAB_00d56782:
      *(byte **)(this + 0x4e0) = pbStack_40;
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanNewLine
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,uVar11);
      pbVar14 = *(byte **)(this + 0x4e0);
      goto LAB_00d5654c;
    case 0x72:
      local_32 = L'\r';
      uVar12 = 0xd;
      break;
    case 0x74:
      local_32 = L'\t';
      uVar12 = 9;
      break;
    case 0x75:
      local_32 = L'\0';
      if (pbStack_40 < last) {
        cVar13 = (char16)*pbStack_40;
      }
      else {
        cVar13 = L'\0';
      }
      pbStack_40 = pbVar14 + 3;
      BVar7 = Js::NumberUtilities::FHexDigit(cVar13,(int *)&local_38);
      uVar12 = local_38;
      if (BVar7 != 0) {
        if (pbStack_40 < last) {
          cVar13 = (char16)*pbStack_40;
        }
        else {
          cVar13 = L'\0';
        }
        pbStack_40 = pbStack_40 + 1;
        BVar7 = Js::NumberUtilities::FHexDigit(cVar13,(int *)&local_38);
        if (BVar7 == 0) {
          local_44 = -0x7ff5fc01;
          goto LAB_00d56ae3;
        }
        iVar8 = local_38 * 0x100 + uVar12 * 0x1000;
        goto LAB_00d5689d;
      }
      local_44 = -0x7ff5fc01;
      if ((cVar13 != L'{') || (this[0x509] != (Scanner<UTF8EncodingPolicyBase<false>>)0x1))
      goto LAB_00d56ae3;
      if (pbStack_40 < last) {
        cVar13 = (char16)*pbStack_40;
      }
      else {
        cVar13 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar7 = Js::NumberUtilities::FHexDigit(cVar13,(int *)&local_38);
      uVar12 = local_38;
      if (BVar7 == 0) goto LAB_00d56ae3;
      while( true ) {
        if (pbStack_40 < last) {
          cVar13 = (char16)*pbStack_40;
        }
        else {
          cVar13 = L'\0';
        }
        pbStack_40 = pbStack_40 + 1;
        BVar7 = Js::NumberUtilities::FHexDigit(cVar13,(int *)&local_38);
        if (BVar7 == 0) break;
        uVar12 = uVar12 * 0x10 + local_38;
        if (0x10ffff < uVar12) {
          local_44 = -0x7ff5fbd9;
          goto LAB_00d56ae3;
        }
      }
      if (cVar13 != L'}') {
        local_44 = -0x7ff5fbd8;
        goto LAB_00d56ae3;
      }
      if (uVar12 < 0x110000) {
        if (uVar12 < 0x10000) goto LAB_00d56914;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                           ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
        if (!bVar6) {
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
      }
      local_46 = L'\0';
      Js::NumberUtilities::CodePointAsSurrogatePair(uVar12,&local_46,&local_32);
      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_46);
      uVar12 = (uint)(ushort)local_32;
      break;
    case 0x76:
      local_32 = L'\v';
      uVar12 = 0xb;
      break;
    case 0x78:
      local_32 = L'\0';
      iVar8 = 0;
LAB_00d5689d:
      if (pbStack_40 < last) {
        cVar13 = (char16)*pbStack_40;
      }
      else {
        cVar13 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar7 = Js::NumberUtilities::FHexDigit(cVar13,(int *)&local_38);
      uVar12 = local_38;
      local_44 = -0x7ff5fc01;
      if (BVar7 == 0) {
LAB_00d56ae3:
        *(byte **)(this + 0x4e0) = pbStack_40 + -1;
        Scanner<UTF8EncodingPolicyBase<false>_>::Error
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,local_44);
      }
      if (pbStack_40 < last) {
        cVar13 = (char16)*pbStack_40;
      }
      else {
        cVar13 = L'\0';
      }
      pbStack_40 = pbStack_40 + 1;
      BVar7 = Js::NumberUtilities::FHexDigit(cVar13,(int *)&local_38);
      if ((BVar7 == 0) || (uVar12 = uVar12 * 0x10 + iVar8 + local_38, 0xffff < uVar12))
      goto LAB_00d56ae3;
LAB_00d56914:
      local_32 = (char16)uVar12;
      break;
    default:
      if (3 < bVar2 - 0x30) {
        if (3 < bVar2 - 0x34) {
          if (bVar2 == 0) goto LAB_00d5666d;
          uVar11 = (uint)bVar2;
          if ((bVar2 == 10) || (bVar2 == 0xd)) goto LAB_00d56782;
          if (bVar2 == 0x66) {
            local_32 = L'\f';
            uVar12 = 0xc;
          }
          else {
            if (bVar2 != 0x62) goto switchD_00d56689_caseD_6f;
            local_32 = L'\b';
            uVar12 = 8;
          }
          break;
        }
        uVar12 = (ushort)local_32 - 0x30;
        local_32 = (char16)uVar12;
        this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 0xc);
        pbVar14 = pbStack_40;
LAB_00d566ed:
        pbStack_40 = pbVar14;
        if (last <= pbVar14) {
          local_38 = 0xffffffd0;
          break;
        }
        local_38 = *pbVar14 - 0x30;
        if ((local_38 & 0xfff8) != 0) break;
        uVar12 = local_38 + uVar12 * 8;
        pbStack_40 = pbVar14 + 1;
        goto LAB_00d56914;
      }
      uVar12 = (ushort)local_32 - 0x30;
      local_32 = (char16)uVar12;
      pbVar14 = pbVar14 + 3;
      if (pbStack_40 < last) {
        local_38 = *pbStack_40 - 0x30;
        uVar11 = local_38 & 0xffff;
        if ((local_38 & 0xffff) < 8) {
          this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 0xc);
          uVar12 = local_38 + uVar12 * 8;
          local_32 = (char16)uVar12;
          goto LAB_00d566ed;
        }
      }
      else {
        local_38 = 0xffffffd0;
        uVar11 = 0xffd0;
      }
      if ((local_32 != L'\0') || (uVar11 < 10)) {
        this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 0xc);
      }
    }
LAB_00d565cd:
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
              ((TemporaryBuffer *)(this + 0x510),uVar12 & 0xffff);
    pbVar14 = pbStack_40;
    goto LAB_00d5654c;
  }
  if ((ushort)bVar2 != delim) goto LAB_00d565cd;
  if (((byte)this[0x508] & 0x40) == 0) {
    prgch = *(char16_t **)(this + 0x520);
    cch = *(uint32 *)(this + 0x51c);
LAB_00d56a25:
    puVar4 = *(undefined8 **)(this + 0x4b8);
    pIVar10 = HashTbl::PidHashNameLen<char16_t>((HashTbl *)(this + 0x20),prgch,cch);
    *puVar4 = pIVar10;
    puVar4[1] = 0;
  }
  else {
    if (*(int *)(this + 0x51c) == 10) {
      prgch = *(char16_t **)(this + 0x520);
      iVar8 = bcmp(L"use strict",prgch,0x14);
      if (iVar8 == 0) {
        cch = 10;
        goto LAB_00d56a25;
      }
    }
    puVar4 = *(undefined8 **)(this + 0x4b8);
    *puVar4 = 0;
    puVar4[1] = 0;
  }
  *(undefined4 *)(this + 0x744) = 0;
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)
                ((byte)this[0x508] & 0xfd | (delim == L'\"') * '\x02');
  *pp = pbStack_40;
  return tkStrCon;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}